

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O3

void ConvertWstringToString(wstring *in,string *out)

{
  wchar_t *__first;
  undefined1 local_a0 [8];
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  converter;
  undefined1 local_30 [16];
  
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                     *)local_a0);
  __first = (in->_M_dataplus)._M_p;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::to_bytes((byte_string *)&converter._M_with_cvtstate,
             (wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
              *)local_a0,__first,__first + in->_M_string_length);
  std::__cxx11::string::operator=((string *)out,(string *)&converter._M_with_cvtstate);
  if ((undefined1 *)converter._88_8_ != local_30) {
    operator_delete((void *)converter._88_8_);
  }
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                      *)local_a0);
  return;
}

Assistant:

void ConvertWstringToString(const std::wstring& in, std::string& out)
{
	// It appears that this may be deprecated at some point
	// see https://stackoverflow.com/questions/42946335/deprecated-header-codecvt-replacement
	// It currently creates warnings, and may need to be replaced with platform-specific code

	// setup converter
	using convert_type = std::codecvt_utf8<wchar_t>;
	std::wstring_convert<convert_type, wchar_t> converter;

	// use converter (.to_bytes: wstr->str, .from_bytes: str->wstr)
	out = converter.to_bytes(in);
}